

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::PreserveSourcesForBailOnResultCondition
          (Lowerer *this,Instr *instr,LabelInstr *skipBailOutLabel)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  Instr *instr_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36e6,"(instr)","instr");
    if (!bVar2) goto LAB_005e3e24;
    *puVar4 = 0;
  }
  if (MDStart < instr->m_opcode) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36e7,"(!instr->IsLowered())","!instr->IsLowered()");
    if (!bVar2) goto LAB_005e3e24;
    *puVar4 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36e8,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar2) goto LAB_005e3e24;
    *puVar4 = 0;
  }
  this_00 = instr->m_dst;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36ee,"(dst)","dst");
    if (!bVar2) goto LAB_005e3e24;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::GetStackSym(this_00);
  if (((pSVar5 != (StackSym *)0x0) && ((pSVar5->field_0x19 & 0x20) != 0)) &&
     ((uVar3 = instr->m_opcode - 0x1be, 3 < uVar3 || (uVar3 == 1)))) {
    if (instr->m_src1 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3701,"(instr->GetSrc1())","instr->GetSrc1()");
      if (!bVar2) {
LAB_005e3e24:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = IR::Opnd::IsEqual(this_00,instr->m_src1);
    if (bVar2) {
LAB_005e3e02:
      instr_00 = IR::Instr::SinkDst(instr,Ld_I4,RegNOREG,&skipBailOutLabel->super_Instr);
      LowererMD::ChangeToAssign(instr_00);
      return;
    }
    if (instr->m_src2 != (Opnd *)0x0) {
      bVar2 = IR::Opnd::IsEqual(this_00,instr->m_src2);
      if (bVar2) goto LAB_005e3e02;
    }
  }
  return;
}

Assistant:

void
Lowerer::PreserveSourcesForBailOnResultCondition(IR::Instr *const instr, IR::LabelInstr *const skipBailOutLabel) const
{
    Assert(instr);
    Assert(!instr->IsLowered());
    Assert(!instr->HasBailOutInfo());

    // Since this instruction may bail out, writing to the destination cannot overwrite one of the sources, or we may lose one
    // of the sources needed to redo the equivalent byte code instruction. Determine if the sources need to be preserved.

    const auto dst = instr->GetDst();
    Assert(dst);
    const auto dstStackSym = dst->GetStackSym();
    if(!dstStackSym || !dstStackSym->HasByteCodeRegSlot())
    {
        // We only need to ensure that a byte-code source is not being overwritten
        return;
    }

    switch(instr->m_opcode)
    {
        // The sources of these instructions don't need restoring, or will be restored in the bailout path
        case Js::OpCode::Neg_I4:
            // In case of overflow or zero, the result is the same as the operand
        case Js::OpCode::Add_I4:
        case Js::OpCode::Sub_I4:
            // In case of overflow, there is always enough information to restore the operands
            return;
    }

    Assert(instr->GetSrc1());
    if(!dst->IsEqual(instr->GetSrc1()) && !(instr->GetSrc2() && dst->IsEqual(instr->GetSrc2())))
    {
        // The destination is different from the sources
        return;
    }

    // The destination is the same as one of the sources and the original sources cannot be restored after the instruction, so
    // use a temporary destination for the result and move it back to the original destination after deciding not to bail out
    LowererMD::ChangeToAssign(instr->SinkDst(Js::OpCode::Ld_I4, RegNOREG, skipBailOutLabel));
}